

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O0

value hello_world_class_impl_interface_static_invoke
                (klass cls,class_impl impl,method m,void **args,size_t argc)

{
  size_t argc_local;
  void **args_local;
  method m_local;
  class_impl impl_local;
  klass cls_local;
  
  return (value)0x0;
}

Assistant:

value hello_world_class_impl_interface_static_invoke(klass cls, class_impl impl, method m, class_args args, size_t argc)
{
	// TODO
	(void)cls;
	(void)impl;
	(void)m;
	(void)args;
	(void)argc;

	return NULL;
}